

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

CompressionRecord Imf_3_4::anon_unknown_1::retrieveCompressionRecord(Header *hdr)

{
  bool bVar1;
  pointer ppVar2;
  undefined8 in_RDI;
  iterator i;
  lock_guard<std::mutex> lk;
  CompressionStash *s;
  CompressionRecord retval;
  map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
  *in_stack_ffffffffffffffa8;
  CompressionRecord *in_stack_ffffffffffffffb0;
  _Self local_48 [3];
  undefined8 local_30;
  _Self local_28 [2];
  CompressionStash *local_18;
  undefined8 local_10;
  CompressionRecord local_8;
  
  local_10 = in_RDI;
  CompressionRecord::CompressionRecord(in_stack_ffffffffffffffb0);
  local_18 = getStash();
  if (local_18 != (CompressionStash *)0x0) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,
               (mutex_type *)in_stack_ffffffffffffffa8);
    local_30 = local_10;
    local_28[0]._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x1d7fd5);
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(local_28,local_48);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>
                             *)0x1d8018);
      local_8 = ppVar2->second;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d8047);
  }
  return local_8;
}

Assistant:

static CompressionRecord
retrieveCompressionRecord (const Header* hdr)
{
    CompressionRecord retval;

    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (hdr);
        if (i != s->_store.end ()) retval = i->second;
    }
    return retval;
}